

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O0

void __thiscall QPDFArgParser::handleCompletion(QPDFArgParser *this)

{
  reference pbVar1;
  bool bVar2;
  byte bVar3;
  element_type *peVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  ostream *this_00;
  __type_conflict1 local_1d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  reference local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *iter;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8 [32];
  string local_b8 [8];
  string candidate;
  size_t space;
  char before_cur;
  size_t end_mark;
  undefined1 local_50 [8];
  string choice_option;
  string extra_prefix;
  QPDFArgParser *this_local;
  
  std::__cxx11::string::string((string *)(choice_option.field_2._M_local_buf + 8));
  peVar4 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  bVar2 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&peVar4->completions);
  if (!bVar2) goto LAB_001c47cb;
  std::__cxx11::string::string((string *)local_50);
  std::__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)this);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
LAB_001c4448:
    peVar4 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    bVar2 = std::operator==(&peVar4->bash_prev,"=");
    if (bVar2) {
      std::__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)this);
      uVar5 = std::__cxx11::string::length();
      std::__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)this);
      lVar6 = std::__cxx11::string::length();
      if (lVar6 + 1U < uVar5) {
        std::__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)this);
        std::__cxx11::string::length();
        std::__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)this);
        std::__cxx11::string::length();
        peVar4 = std::
                 __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        pcVar7 = (char *)std::__cxx11::string::at((ulong)&peVar4->bash_line);
        if (*pcVar7 == '=') {
          peVar4 = std::
                   __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          candidate.field_2._8_8_ = std::__cxx11::string::find_last_of((char)peVar4 + -0x68,0x20);
          if (candidate.field_2._8_8_ != -1) {
            peVar4 = std::
                     __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
            std::__cxx11::string::substr((ulong)local_b8,(ulong)&peVar4->bash_line);
            uVar5 = std::__cxx11::string::length();
            if (((2 < uVar5) &&
                (pcVar7 = (char *)std::__cxx11::string::at((ulong)local_b8), *pcVar7 == '-')) &&
               (pcVar7 = (char *)std::__cxx11::string::at((ulong)local_b8), *pcVar7 == '-')) {
              std::__cxx11::string::substr((ulong)local_d8,(ulong)local_b8);
              std::__cxx11::string::operator=((string *)local_50,local_d8);
              std::__cxx11::string::~string(local_d8);
            }
            std::__cxx11::string::~string(local_b8);
          }
        }
      }
    }
  }
  else {
    std::__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this);
    uVar5 = std::__cxx11::string::length();
    if (uVar5 < 3) goto LAB_001c4448;
    peVar4 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    pcVar7 = (char *)std::__cxx11::string::at((ulong)&peVar4->bash_prev);
    if (*pcVar7 != '-') goto LAB_001c4448;
    peVar4 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    pcVar7 = (char *)std::__cxx11::string::at((ulong)&peVar4->bash_prev);
    if (*pcVar7 != '-') goto LAB_001c4448;
    peVar4 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this);
    std::__cxx11::string::length();
    pcVar7 = (char *)std::__cxx11::string::at((ulong)&peVar4->bash_line);
    if (*pcVar7 != '=') goto LAB_001c4448;
    peVar4 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::__cxx11::string::substr((ulong)&end_mark,(ulong)&peVar4->bash_prev);
    std::__cxx11::string::operator=((string *)local_50,(string *)&end_mark);
    std::__cxx11::string::~string((string *)&end_mark);
  }
  peVar4 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if (((peVar4->zsh_completion & 1U) != 0) &&
     (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&prefix.field_2 + 8),"--",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    std::operator+(&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&prefix.field_2 + 8),"=");
    std::__cxx11::string::operator=
              ((string *)(choice_option.field_2._M_local_buf + 8),(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)(prefix.field_2._M_local_buf + 8));
  }
  peVar4 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  insertCompletions(this,peVar4->option_table,(string *)local_50,
                    (string *)((long)&choice_option.field_2 + 8));
  peVar4 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if (peVar4->argc == 1) {
    peVar4 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    insertCompletions(this,&peVar4->help_option_table,(string *)local_50,
                      (string *)((long)&choice_option.field_2 + 8));
  }
  std::__cxx11::string::~string((string *)local_50);
LAB_001c47cb:
  peVar4 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&choice_option.field_2 + 8),&peVar4->bash_cur);
  peVar4 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&peVar4->completions);
  iter = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&peVar4->completions);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&iter), bVar2) {
    local_158 = std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&__end1);
    bVar3 = std::__cxx11::string::empty();
    pbVar1 = local_158;
    local_1d9 = true;
    if ((bVar3 & 1) == 0) {
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)&local_178,(ulong)pbVar1);
      local_1d9 = std::operator==(&local_178,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&__range1);
      std::__cxx11::string::~string((string *)&local_178);
    }
    if (local_1d9 != false) {
      this_00 = std::operator<<((ostream *)&std::cout,(string *)local_158);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  exit(0);
}

Assistant:

void
QPDFArgParser::handleCompletion()
{
    std::string extra_prefix;
    if (m->completions.empty()) {
        // Detect --option=... Bash treats the = as a word separator.
        std::string choice_option;
        if (m->bash_cur.empty() && (m->bash_prev.length() > 2) && (m->bash_prev.at(0) == '-') &&
            (m->bash_prev.at(1) == '-') && (m->bash_line.at(m->bash_line.length() - 1) == '=')) {
            choice_option = m->bash_prev.substr(2, std::string::npos);
        } else if ((m->bash_prev == "=") && (m->bash_line.length() > (m->bash_cur.length() + 1))) {
            // We're sitting at --option=x. Find previous option.
            size_t end_mark = m->bash_line.length() - m->bash_cur.length() - 1;
            char before_cur = m->bash_line.at(end_mark);
            if (before_cur == '=') {
                size_t space = m->bash_line.find_last_of(' ', end_mark);
                if (space != std::string::npos) {
                    std::string candidate = m->bash_line.substr(space + 1, end_mark - space - 1);
                    if ((candidate.length() > 2) && (candidate.at(0) == '-') &&
                        (candidate.at(1) == '-')) {
                        choice_option = candidate.substr(2, std::string::npos);
                    }
                }
            }
        }
        if (m->zsh_completion && (!choice_option.empty())) {
            // zsh wants --option=choice rather than just choice
            extra_prefix = "--" + choice_option + "=";
        }
        insertCompletions(*m->option_table, choice_option, extra_prefix);
        if (m->argc == 1) {
            // Help options are valid only by themselves.
            insertCompletions(m->help_option_table, choice_option, extra_prefix);
        }
    }
    std::string prefix = extra_prefix + m->bash_cur;
    for (auto const& iter: m->completions) {
        if (prefix.empty() || (iter.substr(0, prefix.length()) == prefix)) {
            std::cout << iter << std::endl;
        }
    }
    exit(0);
}